

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  bool bVar1;
  cmMakefile *pcVar2;
  cmLocalGenerator *p;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  undefined1 local_d48 [8];
  RegularExpression currentRegex;
  string currentRegexString;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c48;
  const_iterator itvIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string local_c20;
  char *local_c00;
  char *value_11;
  string ignoreTargetsRegexes;
  string local_bd0;
  allocator local_ba9;
  string local_ba8;
  char *local_b88;
  char *value_10;
  string local_b78;
  allocator local_b51;
  string local_b50;
  char *local_b30;
  char *value_9;
  string local_b20;
  allocator local_af9;
  string local_af8;
  char *local_ad8;
  char *value_8;
  string local_ac8;
  allocator local_aa1;
  string local_aa0;
  char *local_a80;
  char *value_7;
  string local_a70;
  allocator local_a49;
  string local_a48;
  char *local_a28;
  char *value_6;
  string local_a18;
  allocator local_9f1;
  string local_9f0;
  char *local_9d0;
  char *value_5;
  string local_9c0;
  allocator local_999;
  string local_998;
  char *local_978;
  char *value_4;
  string local_968;
  char *local_948;
  char *value_3;
  string local_938;
  char *local_918;
  char *value_2;
  string local_908;
  char *local_8e8;
  char *value_1;
  string local_8d8;
  char *local_8b8;
  char *value;
  char *local_8a8;
  char *inFileName;
  auto_ptr<cmLocalGenerator> lg;
  auto_ptr<cmMakefile> local_880;
  auto_ptr<cmMakefile> mf;
  cmGlobalGenerator ggi;
  allocator local_329;
  string local_328;
  allocator local_2f1;
  string local_2f0;
  undefined1 local_2d0 [8];
  cmake cm;
  char *fallbackSettingsFileName_local;
  char *settingsFileName_local;
  cmGraphVizWriter *this_local;
  
  cm.CurrentSnapshot.Position.Position = (PositionType)fallbackSettingsFileName;
  cmake::cmake((cmake *)local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"",&local_2f1);
  cmake::SetHomeDirectory((cmake *)local_2d0,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"",&local_329);
  cmake::SetHomeOutputDirectory((cmake *)local_2d0,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  cmake::GetCurrentSnapshot((Snapshot *)&ggi.InstallTargetEnabled,(cmake *)local_2d0);
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)&ggi.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&mf,(cmake *)local_2d0);
  pcVar2 = (cmMakefile *)operator_new(0x730);
  cmake::GetCurrentSnapshot((Snapshot *)&lg,(cmake *)local_2d0);
  cmMakefile::cmMakefile(pcVar2,(cmGlobalGenerator *)&mf,(Snapshot *)&lg);
  cmsys::auto_ptr<cmMakefile>::auto_ptr(&local_880,pcVar2);
  pcVar2 = cmsys::auto_ptr<cmMakefile>::get(&local_880);
  p = cmGlobalGenerator::CreateLocalGenerator((cmGlobalGenerator *)&mf,pcVar2);
  cmsys::auto_ptr<cmLocalGenerator>::auto_ptr((auto_ptr<cmLocalGenerator> *)&inFileName,p);
  local_8a8 = settingsFileName;
  bVar1 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar1) {
    local_8a8 = (char *)cm.CurrentSnapshot.Position.Position;
    bVar1 = cmsys::SystemTools::FileExists((char *)cm.CurrentSnapshot.Position.Position);
    if (!bVar1) {
      value._4_4_ = 1;
      goto LAB_00715a9e;
    }
  }
  pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
  bVar1 = cmMakefile::ReadListFile(pcVar2,local_8a8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar3 = std::operator<<(poVar3,local_8a8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_8d8,"GRAPHVIZ_GRAPH_TYPE",(allocator *)((long)&value_1 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_8d8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_1 + 7));
    local_8b8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,pcVar4);
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_908,"GRAPHVIZ_GRAPH_NAME",(allocator *)((long)&value_2 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_908);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
    local_8e8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphName,pcVar4);
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_938,"GRAPHVIZ_GRAPH_HEADER",(allocator *)((long)&value_3 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_3 + 7));
    local_918 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphHeader,pcVar4);
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_968,"GRAPHVIZ_NODE_PREFIX",(allocator *)((long)&value_4 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_968);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_4 + 7));
    local_948 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphNodePrefix,pcVar4);
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_998,"GRAPHVIZ_EXECUTABLES",&local_999);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_998);
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator((allocator<char> *)&local_999);
    local_978 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_9c0,"GRAPHVIZ_EXECUTABLES",(allocator *)((long)&value_5 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_9c0);
      this->GenerateForExecutables = bVar1;
      std::__cxx11::string::~string((string *)&local_9c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_5 + 7));
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9f0,"GRAPHVIZ_STATIC_LIBS",&local_9f1);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_9f0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
    local_9d0 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a18,"GRAPHVIZ_STATIC_LIBS",(allocator *)((long)&value_6 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_a18);
      this->GenerateForStaticLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_a18);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_6 + 7));
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a48,"GRAPHVIZ_SHARED_LIBS",&local_a49);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_a48);
    std::__cxx11::string::~string((string *)&local_a48);
    std::allocator<char>::~allocator((allocator<char> *)&local_a49);
    local_a28 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a70,"GRAPHVIZ_SHARED_LIBS",(allocator *)((long)&value_7 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_a70);
      this->GenerateForSharedLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_a70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_7 + 7));
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_aa0,"GRAPHVIZ_MODULE_LIBS",&local_aa1);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_aa0);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
    local_a80 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_ac8,"GRAPHVIZ_MODULE_LIBS",(allocator *)((long)&value_8 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_ac8);
      this->GenerateForModuleLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_ac8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_8 + 7));
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_af8,"GRAPHVIZ_EXTERNAL_LIBS",&local_af9);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_af8);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator((allocator<char> *)&local_af9);
    local_ad8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b20,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)((long)&value_9 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_b20);
      this->GenerateForExternals = bVar1;
      std::__cxx11::string::~string((string *)&local_b20);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_9 + 7));
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b50,"GRAPHVIZ_GENERATE_PER_TARGET",&local_b51);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_b50);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator((allocator<char> *)&local_b51);
    local_b30 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b78,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator *)((long)&value_10 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_b78);
      this->GeneratePerTarget = bVar1;
      std::__cxx11::string::~string((string *)&local_b78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_10 + 7));
    }
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ba8,"GRAPHVIZ_GENERATE_DEPENDERS",&local_ba9);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_ba8);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
    local_b88 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_bd0,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_bd0);
      this->GenerateDependers = bVar1;
      std::__cxx11::string::~string((string *)&local_bd0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string((string *)&value_11);
    pcVar2 = cmsys::auto_ptr<cmMakefile>::operator->(&local_880);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c20,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_c20);
    std::__cxx11::string::~string((string *)&local_c20);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_c00 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&value_11,pcVar4);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&itvIt);
      cmSystemTools::ExpandListArgument
                ((string *)&value_11,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&itvIt,false);
      local_c50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&itvIt);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_c48,&local_c50);
      while( true ) {
        currentRegexString.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&itvIt);
        bVar1 = __gnu_cxx::operator!=
                          (&local_c48,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&currentRegexString.field_2 + 8));
        if (!bVar1) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_c48);
        std::__cxx11::string::string((string *)&currentRegex.searchstring,(string *)pbVar6);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_d48);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_d48,pcVar4);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar3 = std::operator<<(poVar3,(string *)&currentRegex.searchstring);
          poVar3 = std::operator<<(poVar3,"\"");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(value_type *)local_d48);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_d48);
        std::__cxx11::string::~string((string *)&currentRegex.searchstring);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_c48);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&itvIt);
    }
    std::__cxx11::string::~string((string *)&value_11);
    value._4_4_ = 0;
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",local_8a8,(char *)0x0,(char *)0x0);
    value._4_4_ = 1;
  }
LAB_00715a9e:
  cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr((auto_ptr<cmLocalGenerator> *)&inFileName);
  cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_880);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf);
  cmake::~cmake((cmake *)local_2d0);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmsys::auto_ptr<cmMakefile> mf(
        new cmMakefile(&ggi, cm.GetCurrentSnapshot()));
  cmsys::auto_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(mf.get()));

  const char* inFileName = settingsFileName;

  if ( !cmSystemTools::FileExists(inFileName) )
    {
    inFileName = fallbackSettingsFileName;
    if ( !cmSystemTools::FileExists(inFileName) )
      {
      return;
      }
    }

  if ( !mf->ReadListFile(inFileName) )
    {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
    }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = value; \
    } \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = mf->IsOn(cmakeDefinition); \
    } \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty())
    {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for(std::vector<std::string>::const_iterator itvIt
                                            = ignoreTargetsRegExVector.begin();
        itvIt != ignoreTargetsRegExVector.end();
        ++ itvIt )
      {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str()))
        {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
        }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
      }
    }

}